

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__naturalnumbers
          (ColladaParserAutoGen15Private *this)

{
  ColladaParserAutoGen15Private *this_local;
  
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__naturalnumbers()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__naturalnumbers();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}